

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<SignedLong_Signed_Test>::CreateTest
          (ParameterizedTestFactory<SignedLong_Signed_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<long>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  SignedLong_Signed_Test::SignedLong_Signed_Test((SignedLong_Signed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }